

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_operation<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
               (void)

{
  Underlying_matrix *this;
  uint uVar1;
  pointer puVar2;
  _Hash_node_base *p_Var3;
  pointer pvVar4;
  Column_settings *pCVar5;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar6;
  ulong uVar7;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  uColumns;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_248;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_230;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_200;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
  local_1e8;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
            ();
  local_1e8.colSettings_ = (Column_settings *)operator_new(0x38);
  (((Entry_constructor *)
   &((pool<boost::default_user_allocator_malloc_free> *)local_1e8.colSettings_)->
    super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_1e8.colSettings_)->list).ptr =
       (char *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_1e8.colSettings_)->list).sz = 0;
  ((pool<boost::default_user_allocator_malloc_free> *)local_1e8.colSettings_)->requested_size = 0x20
  ;
  ((pool<boost::default_user_allocator_malloc_free> *)local_1e8.colSettings_)->next_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_1e8.colSettings_)->start_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_1e8.colSettings_)->max_size = 0;
  this = &local_1e8.matrix_;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
              *)this,&local_200,local_1e8.colSettings_);
  puVar2 = local_200.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_200.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    local_200.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  local_248.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar6 = (vector<unsigned_int,std::allocator<unsigned_int>> *)operator_new(0xa8);
  local_248.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pvVar6;
  local_248.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pvVar6 + 0xa8);
  memset(pvVar6,0,0xa8);
  local_230._M_impl._0_4_ = 0;
  local_248.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pvVar6 + 0xa8);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            (pvVar6,&local_230);
  local_230._M_impl._0_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_248.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x18),&local_230);
  local_230._M_impl._0_4_ = 2;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_248.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x30),&local_230);
  local_230._M_impl._0_8_ = 0x500000003;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_248.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x48),&local_230);
  local_230._M_impl._0_8_ = 0x500000004;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_248.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x60),&local_230);
  local_230._M_impl._0_4_ = 5;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_248.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x78),&local_230);
  local_230._M_impl._0_4_ = 6;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_248.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x90),&local_230);
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
            (&local_200,&local_1e8);
  pvVar4 = local_248.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_248.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_248.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = 0;
    pvVar6 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
             local_248.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_buckets
          [uVar7 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count] ==
          (__node_base_ptr)0x0) {
LAB_00180b01:
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var3 = local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_buckets
               [uVar7 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      while ((uint)uVar7 != uVar1) {
        p_Var3 = p_Var3->_M_nxt;
        if ((p_Var3 == (_Hash_node_base *)0x0) ||
           (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
           (ulong)uVar1 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count !=
           uVar7 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count))
        goto LAB_00180b01;
      }
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                  *)&local_230,
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
                  *)(p_Var3 + 2));
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                  *)pvVar6,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                  *)&local_230);
      uVar7 = (ulong)((uint)uVar7 + 1);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_230);
      pvVar6 = pvVar6 + 0x18;
    } while (pvVar6 != (vector<unsigned_int,std::allocator<unsigned_int>> *)pvVar4);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
  ::add_to(this,3,5);
  local_230._M_impl._0_8_ = 0x100000000;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_200.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5),&local_230);
  local_230._M_impl._0_4_ = 3;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_248.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x48),&local_230);
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
            (&local_200,&local_1e8);
  pvVar4 = local_248.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_248.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_248.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = 0;
    pvVar6 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
             local_248.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_buckets
          [uVar7 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count] ==
          (__node_base_ptr)0x0) {
LAB_00180b0d:
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var3 = local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_buckets
               [uVar7 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      while ((uint)uVar7 != uVar1) {
        p_Var3 = p_Var3->_M_nxt;
        if ((p_Var3 == (_Hash_node_base *)0x0) ||
           (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
           (ulong)uVar1 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count !=
           uVar7 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count))
        goto LAB_00180b0d;
      }
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                  *)&local_230,
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
                  *)(p_Var3 + 2));
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                  *)pvVar6,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                  *)&local_230);
      uVar7 = (ulong)((uint)uVar7 + 1);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_230);
      pvVar6 = pvVar6 + 0x18;
    } while (pvVar6 != (vector<unsigned_int,std::allocator<unsigned_int>> *)pvVar4);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
  ::add_to(this,4,5);
  local_230._M_impl._0_8_ = 0x200000000;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_200.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5),&local_230);
  local_230._M_impl._0_4_ = 4;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_248.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x60),&local_230);
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
            (&local_200,&local_1e8);
  pvVar4 = local_248.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_248.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_248.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = 0;
    pvVar6 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
             local_248.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_buckets
          [uVar7 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count] ==
          (__node_base_ptr)0x0) {
LAB_00180b19:
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var3 = local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_buckets
               [uVar7 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      while ((uint)uVar7 != uVar1) {
        p_Var3 = p_Var3->_M_nxt;
        if ((p_Var3 == (_Hash_node_base *)0x0) ||
           (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
           (ulong)uVar1 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count !=
           uVar7 % local_1e8.matrix_.mirrorMatrixU_.matrix_._M_h._M_bucket_count))
        goto LAB_00180b19;
      }
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                  *)&local_230,
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
                  *)(p_Var3 + 2));
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                  *)pvVar6,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>_>
                  *)&local_230);
      uVar7 = (ulong)((uint)uVar7 + 1);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_230);
      pvVar6 = pvVar6 + 0x18;
    } while (pvVar6 != (vector<unsigned_int,std::allocator<unsigned_int>> *)pvVar4);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_248);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
  ::reset(this,local_1e8.colSettings_);
  pCVar5 = local_1e8.colSettings_;
  if ((pool<boost::default_user_allocator_malloc_free> *)local_1e8.colSettings_ !=
      (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)local_1e8.colSettings_);
  }
  operator_delete(pCVar5,0x38);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
  ::~RU_matrix(this);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_200);
  return;
}

Assistant:

void test_ru_operation() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  columns[5].clear();

  std::vector<witness_content<typename Matrix::Column> > uColumns(7);
  if constexpr (Matrix::Option_list::is_z2) {
    uColumns[0] = {0};
    uColumns[1] = {1};
    uColumns[2] = {2};
    uColumns[3] = {3, 5};
    uColumns[4] = {4, 5};
    uColumns[5] = {5};
    uColumns[6] = {6};
  } else {
    uColumns[0] = {{0, 1}};
    uColumns[1] = {{1, 1}};
    uColumns[2] = {{2, 1}};
    uColumns[3] = {{3, 1}};
    uColumns[4] = {{4, 1}};
    uColumns[5] = {{3, 4}, {4, 4}, {5, 1}};
    uColumns[6] = {{6, 1}};
  }

  test_content_equality(columns, m);
  unsigned int i = 0;
  if constexpr (is_indexed_by_position<Matrix>()) {
    for (auto& b : uColumns) {
      test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++, false)));
    }
  }

  m.add_to(3, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 1};
    uColumns[3] = {3};
  } else {
    columns[5] = {{0, 1}, {1, 4}};
    uColumns[5] = {{4, 4}, {5, 1}};
  }
  test_content_equality(columns, m);
  if constexpr (is_indexed_by_position<Matrix>()) {
    i = 0;
    for (auto& b : uColumns) {
      test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++, false)));
    }
  }

  m.add_to(4, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 2};
    uColumns[4] = {4};
  } else {
    columns[5] = {{0, 1}, {2, 4}};
    uColumns[5] = {{5, 1}};
  }
  test_content_equality(columns, m);
  if constexpr (is_indexed_by_position<Matrix>()) {
    i = 0;
    for (auto& b : uColumns) {
      test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++, false)));
    }
  }

  if constexpr (!Matrix::Option_list::is_z2 || !is_RU<Matrix>()) {
    m.multiply_target_and_add_to(5, 3, 3);
    if constexpr (Matrix::Option_list::is_z2) {
      columns[3] = {1, 2};
      uColumns[5] = {3, 5};
    } else {
      columns[3] = {{0, 4}, {1, 2}, {2, 4}};
      uColumns[3] = {{3, 3}, {5, 1}};
    }
    test_content_equality(columns, m);
    if constexpr (is_indexed_by_position<Matrix>()) {
      i = 0;
      for (auto& b : uColumns) {
        test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++, false)));
      }
    }

    m.multiply_source_and_add_to(4, 5, 4);
    if constexpr (Matrix::Option_list::is_z2) {
      columns[4] = {1, 2};
      uColumns[4] = {4};
    } else {
      columns[4] = {{0, 4}, {1, 1}};
      uColumns[4] = {{4, 1}, {5, 4}};
    }
    test_content_equality(columns, m);
    if constexpr (is_indexed_by_position<Matrix>()) {
      i = 0;
      for (auto& b : uColumns) {
        test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++, false)));
      }
    }
  }
}